

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-syscalls.c
# Opt level: O0

int uv__pipe2(int *pipefd,int flags)

{
  long lVar1;
  int result;
  int flags_local;
  int *pipefd_local;
  
  lVar1 = syscall(0x125,pipefd,(ulong)(uint)flags);
  return (int)lVar1;
}

Assistant:

int uv__pipe2(int pipefd[2], int flags) {
#if defined(__NR_pipe2)
  int result;
  result = syscall(__NR_pipe2, pipefd, flags);
#if MSAN_ACTIVE
  if (!result)
    __msan_unpoison(pipefd, sizeof(int[2]));
#endif
  return result;
#else
  return errno = ENOSYS, -1;
#endif
}